

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O1

word zzAdd2(word *b,word *a,size_t n)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (n != 0) {
    sVar6 = 0;
    uVar4 = 0;
    do {
      uVar3 = a[sVar6];
      uVar5 = uVar4 + a[sVar6];
      puVar1 = b + sVar6;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar5;
      uVar4 = (ulong)(CARRY8(uVar2,uVar5) || CARRY8(uVar4,uVar3));
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
    return uVar4;
  }
  return 0;
}

Assistant:

word zzAdd2(word b[], const word a[], size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		b[i] += w;
		carry |= wordLess01(b[i], w);
#else
		w = a[i] + carry;
		if (w >= carry)
			w += b[i], carry = w < b[i], b[i] = w;
#endif
	}
	w = 0;
	return carry;
}